

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O3

int Ssw_ManSetConstrPhases(Aig_Man_t *p,int nFrames,Vec_Int_t **pvInits)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  if (pvInits != (Vec_Int_t **)0x0) {
    *pvInits = (Vec_Int_t *)0x0;
  }
  pAig = Ssw_FramesWithConstraints(p,nFrames);
  p_00 = Cnf_Derive(pAig,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig);
    iVar2 = 1;
  }
  else {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if (iVar1 == 1 && pvInits != (Vec_Int_t **)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nCap = 1000;
      pVVar3->nSize = 0;
      piVar4 = (int *)malloc(4000);
      pVVar3->pArray = piVar4;
      *pvInits = pVVar3;
      pVVar5 = pAig->vCis;
      if (0 < pVVar5->nSize) {
        lVar6 = 0;
        do {
          pVVar3 = *pvInits;
          iVar2 = sat_solver_var_value
                            (s,p_00->pVarNums[*(int *)((long)pVVar5->pArray[lVar6] + 0x24)]);
          Vec_IntPush(pVVar3,iVar2);
          lVar6 = lVar6 + 1;
          pVVar5 = pAig->vCis;
        } while (lVar6 < pVVar5->nSize);
      }
    }
    sat_solver_delete(s);
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig);
    iVar2 = 1;
    if (iVar1 != -1) {
      iVar2 = -(uint)(iVar1 != 1);
    }
  }
  return iVar2;
}

Assistant:

int Ssw_ManSetConstrPhases( Aig_Man_t * p, int nFrames, Vec_Int_t ** pvInits )
{
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, RetValue;
    if ( pvInits )
        *pvInits = NULL;
//    assert( p->nConstrs > 0 );
    // derive the timeframes
    pFrames = Ssw_FramesWithConstraints( p, nFrames );
    // create CNF
    pCnf = Cnf_Derive( pFrames, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        Aig_ManStop( pFrames );
        return 1;
    }
    // solve
    RetValue = sat_solver_solve( pSat, NULL, NULL,
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_True && pvInits )
    {
        *pvInits = Vec_IntAlloc( 1000 );
        Aig_ManForEachCi( pFrames, pObj, i )
            Vec_IntPush( *pvInits, sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) );

//        Aig_ManForEachCi( pFrames, pObj, i )
//            Abc_Print( 1, "%d", Vec_IntEntry(*pvInits, i) );
//        Abc_Print( 1, "\n" );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    if ( RetValue == l_False )
        return 1;
    if ( RetValue == l_True )
        return 0;
    return -1;
}